

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseTagTypeSpecifier_AtFirst<psy::C::EnumDeclarationSyntax>
          (Parser *this,DeclarationSyntax **decl,SpecifierSyntax **spec,SyntaxKind declK,
          SyntaxKind specK,offset_in_Parser_to_subr parseMember)

{
  char cVar1;
  SyntaxToken *pSVar2;
  TagTypeSpecifierSyntax *pTVar3;
  IndexType IVar4;
  DeclarationSyntax *pDVar5;
  ostream *poVar6;
  code *pcVar7;
  SyntaxNodePlainList<psy::C::DeclarationSyntax_*> *pSVar8;
  DeclarationListSyntax **ppDVar9;
  code *in_stack_00000008;
  long *in_stack_00000010;
  SyntaxKind local_44;
  SyntaxKind local_42;
  long *local_40;
  DeclarationSyntax *local_38;
  
  local_40 = in_stack_00000010;
  local_44 = specK;
  local_42 = declK;
  pSVar2 = peek(this,1);
  if ((pSVar2->syntaxK_ == Keyword_struct) ||
     (pSVar2 = peek(this,1), pSVar2->syntaxK_ == Keyword_union)) {
    if (2 < (ushort)(declK - StructDeclaration)) goto LAB_002ba11e;
  }
  else {
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ != Keyword_enum || 2 < (ushort)(declK - StructDeclaration))
    goto LAB_002ba11e;
  }
  if ((ushort)(specK - StructTypeSpecifier) < 3) {
    pTVar3 = makeNode<psy::C::TagTypeSpecifierSyntax,psy::C::SyntaxKind&>(this,&local_44);
    *spec = &pTVar3->super_SpecifierSyntax;
    IVar4 = consume(this);
    pTVar3->kwTkIdx_ = IVar4;
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
      parseExtGNU_AttributeSpecifierList_AtFirst(this,&pTVar3->attrs1_);
    }
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ != OpenBraceToken) {
      if (pSVar2->syntaxK_ != IdentifierToken) {
        DiagnosticsReporter::ExpectedFollowOfStructOrUnionOrEnum(&this->diagReporter_);
        return false;
      }
      IVar4 = consume(this);
      pTVar3->tagTkIdx_ = IVar4;
      pSVar2 = peek(this,1);
      if (pSVar2->syntaxK_ != OpenBraceToken) {
        if (pSVar2->syntaxK_ != SemicolonToken) {
          return true;
        }
        if ((ushort)(local_44 - StructTypeSpecifier) < 2) {
          pDVar5 = (DeclarationSyntax *)
                   makeNode<psy::C::EnumDeclarationSyntax,psy::C::SyntaxKind&>(this,&local_42);
          *decl = pDVar5;
          pDVar5[1].super_SyntaxNode.super_Managed._vptr_Managed = (_func_int **)pTVar3;
          return true;
        }
        return true;
      }
    }
    IVar4 = consume(this);
    pTVar3->openBraceTkIdx_ = IVar4;
    pDVar5 = (DeclarationSyntax *)
             makeNode<psy::C::EnumDeclarationSyntax,psy::C::SyntaxKind&>(this,&local_42);
    *decl = pDVar5;
    pDVar5[1].super_SyntaxNode.super_Managed._vptr_Managed = (_func_int **)pTVar3;
    local_38 = (DeclarationSyntax *)0x0;
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ != CloseBraceToken) {
      ppDVar9 = &pTVar3->decls_;
      local_40 = (long *)((long)local_40 + (long)this);
      do {
        pcVar7 = in_stack_00000008;
        if (((ulong)in_stack_00000008 & 1) != 0) {
          pcVar7 = *(code **)(in_stack_00000008 + *local_40 + -1);
        }
        cVar1 = (*pcVar7)(local_40,&local_38);
        if (cVar1 == '\0') {
          ignoreMemberDeclaration(this);
          pSVar2 = peek(this,1);
          if (pSVar2->syntaxK_ == EndOfFile) {
            return false;
          }
        }
        pSVar8 = makeNode<psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>,psy::C::DeclarationSyntax*&>
                           (this,&local_38);
        *ppDVar9 = pSVar8;
        ppDVar9 = &(pSVar8->
                   super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                   ).
                   super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                   .next;
        local_38 = (DeclarationSyntax *)0x0;
        pSVar2 = peek(this,1);
      } while (pSVar2->syntaxK_ != CloseBraceToken);
    }
    IVar4 = consume(this);
    pTVar3->closeBraceTkIdx_ = IVar4;
    pSVar2 = peek(this,1);
    if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
      parseExtGNU_AttributeSpecifierList_AtFirst(this,&pTVar3->attrs2_);
      return true;
    }
    return true;
  }
LAB_002ba11e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x600);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"assert failure: `struct\', `union\', or `enum\'",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return false;
}

Assistant:

bool Parser::parseTagTypeSpecifier_AtFirst(
        DeclarationSyntax*& decl,
        SpecifierSyntax*& spec,
        SyntaxKind declK,
        SyntaxKind specK,
        bool (Parser::*parseMember)(DeclarationSyntax*&))
{
    DBG_THIS_RULE();
    PSY_ASSERT_3((peek().kind() == SyntaxKind::Keyword_struct
                        || peek().kind() == SyntaxKind::Keyword_union
                        || peek().kind() == SyntaxKind::Keyword_enum)
                    && (declK == SyntaxKind::StructDeclaration
                        || declK == SyntaxKind::UnionDeclaration
                        || declK == SyntaxKind::EnumDeclaration)
                    && (specK == SyntaxKind::StructTypeSpecifier
                        || specK == SyntaxKind::UnionTypeSpecifier
                        || specK == SyntaxKind::EnumTypeSpecifier),
                  return false,
                  "assert failure: `struct', `union', or `enum'");

    auto tySpec = makeNode<TagTypeSpecifierSyntax>(specK);
    spec = tySpec;
    tySpec->kwTkIdx_ = consume();

    if (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__)
        parseExtGNU_AttributeSpecifierList_AtFirst(tySpec->attrs1_);

    auto wrapTySpecInTyDecl = [&]() {
        auto tyDecl = makeNode<TypeDeclT>(declK);
        decl = tyDecl;
        tyDecl->typeSpec_ = tySpec;
    };

    switch (peek().kind()) {
        case SyntaxKind::OpenBraceToken:
            tySpec->openBraceTkIdx_ = consume();
            break;

        case SyntaxKind::IdentifierToken:
            tySpec->tagTkIdx_ = consume();
            switch (peek().kind()) {
                case SyntaxKind::OpenBraceToken:
                    tySpec->openBraceTkIdx_ = consume();
                    break;

                case SyntaxKind::SemicolonToken:
                    if (specK == SyntaxKind::StructTypeSpecifier
                            || specK == SyntaxKind::UnionTypeSpecifier) {
                        wrapTySpecInTyDecl();
                        return true;
                    }
                    [[fallthrough]];

                default:
                    return true;
            }
            break;

        default:
            diagReporter_.ExpectedFollowOfStructOrUnionOrEnum();
            return false;
    }

    wrapTySpecInTyDecl();

    DeclarationListSyntax** declList_cur = &tySpec->decls_;

    while (true) {
        DeclarationSyntax* membDecl = nullptr;
        switch (peek().kind()) {
            case SyntaxKind::CloseBraceToken:
                tySpec->closeBraceTkIdx_ = consume();
                goto MembersParsed;

            default:
                if (!((this)->*(parseMember))(membDecl)) {
                    ignoreMemberDeclaration();
                    if (peek().kind() == SyntaxKind::EndOfFile)
                        return false;
                }
                break;
        }
        *declList_cur = makeNode<DeclarationListSyntax>(membDecl);
        declList_cur = &(*declList_cur)->next;
    }

MembersParsed:
    if (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__)
        parseExtGNU_AttributeSpecifierList_AtFirst(tySpec->attrs2_);

    return true;
}